

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::setUseColour(ConfigData *config,string *value)

{
  int iVar1;
  runtime_error *this;
  YesOrNo YVar2;
  undefined1 local_38 [8];
  string mode;
  
  toLower((string *)local_38,value);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
    YVar2 = Yes;
  }
  else {
    iVar1 = std::__cxx11::string::compare(local_38);
    if (iVar1 == 0) {
      YVar2 = No;
    }
    else {
      iVar1 = std::__cxx11::string::compare(local_38);
      YVar2 = Auto;
      if (iVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"colour mode must be one of: auto, yes or no");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  config->useColour = YVar2;
  if (local_38 != (undefined1  [8])&mode._M_string_length) {
    operator_delete((void *)local_38,mode._M_string_length + 1);
  }
  return;
}

Assistant:

inline void setUseColour( ConfigData& config, std::string const& value ) {
        std::string mode = toLower( value );

        if( mode == "yes" )
            config.useColour = UseColour::Yes;
        else if( mode == "no" )
            config.useColour = UseColour::No;
        else if( mode == "auto" )
            config.useColour = UseColour::Auto;
        else
            throw std::runtime_error( "colour mode must be one of: auto, yes or no" );
    }